

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_sub_impl(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,_Bool inplace)

{
  bool bVar1;
  _Bool _Var2;
  ggml_tensor *ctx_00;
  ggml_tensor *pgVar3;
  byte in_CL;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  _Bool is_node;
  ggml_tensor *in_stack_ffffffffffffffc8;
  ggml_context *in_stack_ffffffffffffffd0;
  
  _Var2 = ggml_are_same_shape(in_RSI,in_RDX);
  if (!_Var2) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xc13,
            "ggml_are_same_shape(a, b)");
    abort();
  }
  bVar1 = false;
  if (((in_CL & 1) == 0) &&
     ((in_RSI->grad != (ggml_tensor *)0x0 || (in_RDX->grad != (ggml_tensor *)0x0)))) {
    bVar1 = true;
  }
  if ((in_CL & 1) == 0) {
    ctx_00 = ggml_dup_tensor(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    ctx_00 = ggml_view_tensor(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  ctx_00->op = GGML_OP_SUB;
  if (bVar1) {
    pgVar3 = ggml_dup_tensor((ggml_context *)ctx_00,in_stack_ffffffffffffffc8);
  }
  else {
    pgVar3 = (ggml_tensor *)0x0;
  }
  ctx_00->grad = pgVar3;
  ctx_00->src0 = in_RSI;
  ctx_00->src1 = in_RDX;
  return ctx_00;
}

Assistant:

struct ggml_tensor * ggml_sub_impl(
        struct ggml_context * ctx,
        struct ggml_tensor * a,
        struct ggml_tensor * b,
        bool inplace) {
    GGML_ASSERT(ggml_are_same_shape(a, b));

    bool is_node = false;

    if (!inplace && (a->grad || b->grad)) {
        is_node = true;
    }

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    result->op   = GGML_OP_SUB;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = b;

    return result;
}